

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTIMUMPU9150.cpp
# Opt level: O2

bool __thiscall RTIMUMPU9150::setCompassRate(RTIMUMPU9150 *this)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  
  lVar1 = (long)(this->super_RTIMU).m_sampleRate / (long)this->m_compassRate;
  lVar2 = 0x20;
  if ((int)lVar1 < 0x20) {
    lVar2 = lVar1;
  }
  bVar3 = RTIMUHal::HALWrite(&((this->super_RTIMU).m_settings)->super_RTIMUHal,this->m_slaveAddr,'4'
                             ,(char)lVar2 + 0xff,"Failed to set slave ctrl 4");
  return bVar3;
}

Assistant:

bool RTIMUMPU9150::setCompassRate()
{
    int rate;

    rate = m_sampleRate / m_compassRate - 1;

    if (rate > 31)
        rate = 31;
    if (!m_settings->HALWrite(m_slaveAddr, MPU9150_I2C_SLV4_CTRL, rate, "Failed to set slave ctrl 4"))
         return false;
    return true;
}